

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O3

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::string_helper::
write<pstore::serialize::archive::database_writer&,std::__cxx11::string>
          (database_writer *archive,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  pointer pcVar1;
  uchar *puVar2;
  result_type rVar3;
  uchar *size;
  span<unsigned_char,__1L> sp;
  span<const_char,__1L> sp_00;
  array<unsigned_char,_9UL> encoded_length;
  uchar local_39 [9];
  extent_type<_1L> local_30 [2];
  
  puVar2 = varint::encode<unsigned_char*>(str->_M_string_length,local_39);
  size = puVar2 + -(long)local_39;
  if ((uchar *)0xfffffffffffffff6 < size + -10) {
    if (size == (uchar *)0x1) {
      *puVar2 = '\0';
      size = puVar2 + (1 - (long)local_39);
    }
    gsl::details::extent_type<-1L>::extent_type(local_30,(index_type)size);
    sp.storage_.data_ = local_39;
    sp.storage_.super_extent_type<_1L>.size_ = local_30[0].size_;
    rVar3 = serialize::archive::
            writer_base<pstore::serialize::archive::details::database_writer_policy>::
            putn<pstore::gsl::span<unsigned_char,_1l>>
                      (&archive->
                        super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                       ,sp);
    pcVar1 = (str->_M_dataplus)._M_p;
    gsl::details::extent_type<-1L>::extent_type(local_30,str->_M_string_length);
    sp_00.storage_.data_ = pcVar1;
    sp_00.storage_.super_extent_type<_1L>.size_ = local_30[0].size_;
    serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
    putn<pstore::gsl::span<char_const,_1l>>
              (&archive->
                super_writer_base<pstore::serialize::archive::details::database_writer_policy>,sp_00
              );
    return (archive_result_type<pstore::serialize::archive::database_writer_&>)rVar3.a_;
  }
  assert_failed("length_bytes > 0 && static_cast<std::size_t> (length_bytes) <= encoded_length.size ()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                ,0x3e);
}

Assistant:

static auto write (Archive && archive, StringType const & str)
                -> archive_result_type<Archive> {
                auto const length = str.length ();

                // Encode the string length as a variable-length integer.
                std::array<std::uint8_t, varint::max_output_length> encoded_length;
                auto first = std::begin (encoded_length);
                auto last = varint::encode (length, first);
                auto length_bytes = std::distance (first, last);
                PSTORE_ASSERT (length_bytes > 0 &&
                               static_cast<std::size_t> (length_bytes) <= encoded_length.size ());
                if (length_bytes == 1) {
                    *(last++) = 0;
                }
                // Emit the string length.
                auto const resl = serialize::write (archive, gsl::make_span (&(*first), &(*last)));

                // Emit the string body.
                serialize::write (archive, gsl::make_span (str));
                return resl;
            }